

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::RepeatedEnumFieldGenerator::GenerateExtensionCode
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  Options *options;
  string_view text;
  
  options = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,options,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag(&this->super_FieldGeneratorBase,printer);
  text._M_str = 
  "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, pb::FieldCodec.ForEnum($tag$, x => (int) x, x => ($type_name$) x));\n"
  ;
  text._M_len = 0xed;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, "
    "pb::FieldCodec.ForEnum($tag$, x => (int) x, x => ($type_name$) x));\n");
}